

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

void exit_cb(uv_process_t *process,int64_t exit_status,int term_signal)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int term_signal_local;
  int64_t exit_status_local;
  uv_process_t *process_local;
  
  printf("exit_cb\n");
  exit_cb_called = exit_cb_called + 1;
  if (exit_status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x37,"exit_status","==","0",exit_status,"==",0);
    abort();
  }
  if ((long)term_signal != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x38,"term_signal","==","0",(long)term_signal,"==",0);
    abort();
  }
  uv_close(process,close_cb);
  uv_close(&in,close_cb);
  uv_close(&out,close_cb);
  return;
}

Assistant:

static void exit_cb(uv_process_t* process,
                    int64_t exit_status,
                    int term_signal) {
  printf("exit_cb\n");
  exit_cb_called++;
  ASSERT_EQ(1, exit_status);
  ASSERT_OK(term_signal);
  uv_close((uv_handle_t*) process, close_cb);
}